

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O1

TLVReader * __thiscall
ASDCP::MXF::TLVReader::ReadUi16(TLVReader *this,MDDEntry *Entry,ui16_t *value)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  ushort *in_RCX;
  undefined1 *puVar4;
  
  if (in_RCX == (ushort *)0x0) {
    puVar4 = Kumu::RESULT_PTR;
  }
  else {
    bVar3 = FindTL((TLVReader *)Entry,(MDDEntry *)value);
    if (bVar3) {
      uVar2 = *(uint *)(Entry->ul + 0xc);
      if ((ulong)*(uint *)(Entry->ul + 8) < (ulong)uVar2 + 2) {
        Kumu::Result_t::operator()((int *)this,Kumu::RESULT_FALSE);
        return this;
      }
      uVar1 = *(ushort *)(*(long *)Entry->ul + (ulong)uVar2);
      *in_RCX = uVar1 << 8 | uVar1 >> 8;
      *(uint *)(Entry->ul + 0xc) = uVar2 + 2;
      puVar4 = (undefined1 *)&Kumu::RESULT_OK;
    }
    else {
      puVar4 = Kumu::RESULT_FALSE;
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar4);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::TLVReader::ReadUi16(const MDDEntry& Entry, ui16_t* value)
{
  ASDCP_TEST_NULL(value);

  if ( FindTL(Entry) )
    return MemIOReader::ReadUi16BE(value) ? RESULT_OK : RESULT_FALSE(__LINE__, __FILE__);

  return RESULT_FALSE;
}